

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImBitVector::Create(ImBitVector *this,int sz)

{
  int sz_local;
  ImBitVector *this_local;
  
  ImVector<unsigned_int>::resize(&this->Storage,sz + 0x1f >> 5);
  memset((this->Storage).Data,0,(long)(this->Storage).Size << 2);
  return;
}

Assistant:

void            Create(int sz)              { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }